

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::InstantExecution>::run(AsyncQueue<nrg::InstantExecution> *this)

{
  _Elt_pointer pfVar1;
  _Manager_type p_Var2;
  QueueElement elem;
  unique_lock<std::mutex> lock;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->guard_);
  while( true ) {
    while (pfVar1 = (this->queue_).c.
                    super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->queue_).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur != pfVar1) {
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_58 = (_Manager_type)0x0;
      local_50 = pfVar1->_M_invoker;
      p_Var2 = (pfVar1->super__Function_base)._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        local_68._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
        local_68._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
        (pfVar1->super__Function_base)._M_manager = (_Manager_type)0x0;
        pfVar1->_M_invoker = (_Invoker_type)0x0;
        local_58 = p_Var2;
      }
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->queue_).c);
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::function<void_()>::operator()((function<void_()> *)&local_68);
      std::unique_lock<std::mutex>::lock(&local_40);
      std::_Function_base::~_Function_base((_Function_base *)&local_68);
    }
    if (this->running_ != true) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void run()
    {
        std::unique_lock<std::mutex> lock(guard_);
        while (true) {
            while (!AsyncStyle::isEmpty(queue_)) {
                typename AsyncStyle::QueueElement elem = std::move(AsyncStyle::top(queue_));
                if (AsyncStyle::isDue(elem)) {
                    AsyncStyle::pop(queue_);

                    lock.unlock();
                    try {
                        AsyncStyle::execute(elem);
                    }
                    catch(typename AsyncStyle::ExceptionType& ex) {
                        onError_(ex);
                    }
                    lock.lock();
                } else {
                    cond_.wait_for(lock, AsyncStyle::whenIsDue(elem),
                        [this](){ return AsyncStyle::isDue(AsyncStyle::top(queue_)); });
                }
            }
            if (!running_) {
                break;
            }
            cond_.wait(lock);
        }
    }